

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O3

void __thiscall CHeap::NewChunk(CHeap *this)

{
  CChunk *pCVar1;
  
  pCVar1 = (CChunk *)mem_alloc(0x10020);
  if (pCVar1 != (CChunk *)0x0) {
    pCVar1->m_pMemory = (char *)(pCVar1 + 1);
    pCVar1->m_pCurrent = (char *)(pCVar1 + 1);
    pCVar1->m_pEnd = (char *)(pCVar1 + 0x801);
    pCVar1->m_pNext = this->m_pCurrent;
    this->m_pCurrent = pCVar1;
  }
  return;
}

Assistant:

void CHeap::NewChunk()
{
	// allocate memory
	char *pMem = (char*)mem_alloc(sizeof(CChunk)+CHUNK_SIZE);
	if(!pMem)
		return;

	// the chunk structure is located in the begining of the chunk
	// init it and return the chunk
	CChunk *pChunk = (CChunk*)pMem;
	pChunk->m_pMemory = (char*)(pChunk+1);
	pChunk->m_pCurrent = pChunk->m_pMemory;
	pChunk->m_pEnd = pChunk->m_pMemory + CHUNK_SIZE;
	pChunk->m_pNext = m_pCurrent;

	m_pCurrent = pChunk;
}